

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

PluralRules * __thiscall
icu_63::number::impl::NumberFormatterImpl::resolvePluralRules
          (NumberFormatterImpl *this,PluralRules *rulesPtr,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  PluralRules *p;
  UErrorCode *status_local;
  Locale *locale_local;
  PluralRules *rulesPtr_local;
  NumberFormatterImpl *this_local;
  
  this_local = (NumberFormatterImpl *)rulesPtr;
  if (rulesPtr == (PluralRules *)0x0) {
    UVar1 = LocalPointerBase<const_icu_63::PluralRules>::isNull
                      (&(this->fRules).super_LocalPointerBase<const_icu_63::PluralRules>);
    if (UVar1 != '\0') {
      p = PluralRules::forLocale(locale,status);
      LocalPointer<const_icu_63::PluralRules>::adoptInstead(&this->fRules,p);
    }
    this_local = (NumberFormatterImpl *)
                 LocalPointerBase<const_icu_63::PluralRules>::getAlias
                           (&(this->fRules).super_LocalPointerBase<const_icu_63::PluralRules>);
  }
  return (PluralRules *)this_local;
}

Assistant:

const PluralRules*
NumberFormatterImpl::resolvePluralRules(const PluralRules* rulesPtr, const Locale& locale,
                                        UErrorCode& status) {
    if (rulesPtr != nullptr) {
        return rulesPtr;
    }
    // Lazily create PluralRules
    if (fRules.isNull()) {
        fRules.adoptInstead(PluralRules::forLocale(locale, status));
    }
    return fRules.getAlias();
}